

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_ParseTrackEvents
               (uint8_t **ptr,uint8_t se,FACTTrack *track,FAudioMallocFunc pMalloc)

{
  undefined4 uVar1;
  float fVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  ushort uVar6;
  uint uVar7;
  uint *puVar8;
  uint8_t *puVar9;
  ushort *puVar10;
  uint uVar11;
  FACTEvent *pFVar12;
  void *pvVar13;
  ulong uVar14;
  ushort uVar15;
  ulong uVar16;
  double dVar17;
  
  bVar3 = **ptr;
  *ptr = *ptr + 1;
  track->eventCount = bVar3;
  pFVar12 = (FACTEvent *)(*pMalloc)((ulong)bVar3 * 0x50);
  track->events = pFVar12;
  SDL_memset(pFVar12,0,(ulong)track->eventCount * 0x50);
  if (track->eventCount != '\0') {
    uVar16 = 0;
    do {
      puVar8 = (uint *)*ptr;
      uVar7 = *puVar8;
      *ptr = (uint8_t *)(puVar8 + 1);
      uVar6 = (ushort)puVar8[1];
      uVar15 = uVar6 << 8 | uVar6 >> 8;
      uVar11 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8;
      if (se == '\0') {
        uVar15 = uVar6;
        uVar11 = uVar7;
      }
      *ptr = (uint8_t *)((long)puVar8 + 6);
      pFVar12 = track->events;
      pFVar12[uVar16].randomOffset = uVar15;
      pFVar12[uVar16].type = (ushort)uVar11 & 0x1f;
      pFVar12[uVar16].timestamp = (uint16_t)(uVar11 >> 5);
      *ptr = (uint8_t *)((long)puVar8 + 7);
      pFVar12 = track->events;
      switch(pFVar12[uVar16].type) {
      case 0:
        uVar4 = *(uint8_t *)((long)puVar8 + 7);
        *ptr = (uint8_t *)(puVar8 + 2);
        track->events[uVar16].field_3.wave.flags = uVar4;
        break;
      case 1:
        pFVar12[uVar16].field_3.wave.isComplex = '\0';
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.flags = uVar4;
        uVar6 = *(ushort *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 2);
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *(ushort *)((long)&track->events[uVar16].field_3 + 8) = uVar15;
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        *(uint8_t *)((long)&track->events[uVar16].field_3 + 10) = uVar4;
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.loopCount = uVar4;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.position = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.angle = uVar15;
        track->events[uVar16].field_3.wave.variationFlags = 0;
        break;
      case 3:
        pFVar12[uVar16].field_3.wave.isComplex = '\x01';
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.flags = uVar4;
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.loopCount = uVar4;
        uVar6 = *(ushort *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 2);
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        track->events[uVar16].field_3.wave.position = uVar15;
        uVar6 = *(ushort *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 2);
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        track->events[uVar16].field_3.wave.angle = uVar15;
        uVar7 = *(uint *)*ptr;
        uVar11 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (se == '\0') {
          uVar11 = uVar7;
        }
        *ptr = (uint8_t *)((long)*ptr + 4);
        *(short *)((long)&track->events[uVar16].field_3 + 10) = (short)uVar11;
        *(short *)((long)&track->events[uVar16].field_3 + 8) = (short)(uVar11 >> 0x10);
        *ptr = *ptr + 4;
        pvVar13 = (*pMalloc)((ulong)*(ushort *)((long)&track->events[uVar16].field_3 + 10) * 2);
        *(void **)((long)&track->events[uVar16].field_3 + 0x10) = pvVar13;
        pvVar13 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar16].field_3 + 10));
        *(void **)((long)&track->events[uVar16].field_3 + 0x18) = pvVar13;
        pvVar13 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar16].field_3 + 10));
        *(void **)((long)&track->events[uVar16].field_3 + 0x20) = pvVar13;
        pFVar12 = track->events;
        if (*(short *)((long)&pFVar12[uVar16].field_3 + 10) != 0) {
          uVar14 = 0;
          do {
            puVar10 = (ushort *)*ptr;
            uVar6 = *puVar10;
            *ptr = (uint8_t *)(puVar10 + 1);
            uVar15 = uVar6 << 8 | uVar6 >> 8;
            if (se == '\0') {
              uVar15 = uVar6;
            }
            *(ushort *)(*(long *)((long)&track->events[uVar16].field_3 + 0x10) + uVar14 * 2) =
                 uVar15;
            uVar6 = puVar10[1];
            *ptr = (uint8_t *)((long)puVar10 + 3);
            *(char *)(*(long *)((long)&track->events[uVar16].field_3 + 0x18) + uVar14) = (char)uVar6
            ;
            puVar9 = *ptr;
            uVar4 = *puVar9;
            *ptr = puVar9 + 1;
            uVar5 = puVar9[1];
            *ptr = puVar9 + 2;
            *(uint8_t *)(*(long *)((long)&track->events[uVar16].field_3 + 0x20) + uVar14) =
                 uVar5 - uVar4;
            uVar14 = uVar14 + 1;
            pFVar12 = track->events;
          } while (uVar14 < *(ushort *)((long)&pFVar12[uVar16].field_3 + 10));
        }
        pFVar12[uVar16].field_3.wave.variationFlags = 0;
        break;
      case 4:
        pFVar12[uVar16].field_3.wave.isComplex = '\0';
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.flags = uVar4;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        *(ushort *)((long)&track->events[uVar16].field_3 + 8) = uVar15;
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        *(uint8_t *)((long)&track->events[uVar16].field_3 + 10) = uVar4;
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.loopCount = uVar4;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.position = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.angle = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.minPitch = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.maxPitch = uVar15;
        bVar3 = **ptr;
        *ptr = *ptr + 1;
        dVar17 = (double)SDL_log10((double)bVar3 / 28240.0);
        track->events[uVar16].field_3.wave.minVolume = (float)(dVar17 * 3969.0 + 8715.0);
        bVar3 = **ptr;
        *ptr = *ptr + 1;
        dVar17 = (double)SDL_log10((double)bVar3 / 28240.0);
        track->events[uVar16].field_3.wave.maxVolume = (float)(dVar17 * 3969.0 + 8715.0);
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.minFrequency = fVar2;
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.maxFrequency = fVar2;
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.minQFactor = fVar2;
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.maxQFactor = fVar2;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.variationFlags = uVar15;
        break;
      case 6:
        pFVar12[uVar16].field_3.wave.isComplex = '\x01';
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.flags = uVar4;
        uVar4 = **ptr;
        *ptr = *ptr + 1;
        track->events[uVar16].field_3.wave.loopCount = uVar4;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.position = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.angle = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.minPitch = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.maxPitch = uVar15;
        bVar3 = **ptr;
        *ptr = *ptr + 1;
        dVar17 = (double)SDL_log10((double)bVar3 / 28240.0);
        track->events[uVar16].field_3.wave.minVolume = (float)(dVar17 * 3969.0 + 8715.0);
        bVar3 = **ptr;
        *ptr = *ptr + 1;
        dVar17 = (double)SDL_log10((double)bVar3 / 28240.0);
        track->events[uVar16].field_3.wave.maxVolume = (float)(dVar17 * 3969.0 + 8715.0);
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.minFrequency = fVar2;
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.maxFrequency = fVar2;
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.minQFactor = fVar2;
        fVar2 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        track->events[uVar16].field_3.wave.maxQFactor = fVar2;
        uVar6 = *(ushort *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 2);
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        track->events[uVar16].field_3.wave.variationFlags = uVar15;
        uVar7 = *(uint *)*ptr;
        uVar11 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (se == '\0') {
          uVar11 = uVar7;
        }
        *ptr = (uint8_t *)((long)*ptr + 4);
        *(short *)((long)&track->events[uVar16].field_3 + 10) = (short)uVar11;
        *(short *)((long)&track->events[uVar16].field_3 + 8) = (short)(uVar11 >> 0x10);
        *ptr = *ptr + 4;
        pvVar13 = (*pMalloc)((ulong)*(ushort *)((long)&track->events[uVar16].field_3 + 10) * 2);
        *(void **)((long)&track->events[uVar16].field_3 + 0x10) = pvVar13;
        pvVar13 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar16].field_3 + 10));
        *(void **)((long)&track->events[uVar16].field_3 + 0x18) = pvVar13;
        pvVar13 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar16].field_3 + 10));
        *(void **)((long)&track->events[uVar16].field_3 + 0x20) = pvVar13;
        if (*(short *)((long)&track->events[uVar16].field_3 + 10) != 0) {
          uVar14 = 0;
          do {
            puVar10 = (ushort *)*ptr;
            uVar6 = *puVar10;
            *ptr = (uint8_t *)(puVar10 + 1);
            uVar15 = uVar6 << 8 | uVar6 >> 8;
            if (se == '\0') {
              uVar15 = uVar6;
            }
            *(ushort *)(*(long *)((long)&track->events[uVar16].field_3 + 0x10) + uVar14 * 2) =
                 uVar15;
            uVar6 = puVar10[1];
            *ptr = (uint8_t *)((long)puVar10 + 3);
            *(char *)(*(long *)((long)&track->events[uVar16].field_3 + 0x18) + uVar14) = (char)uVar6
            ;
            puVar9 = *ptr;
            uVar4 = *puVar9;
            *ptr = puVar9 + 1;
            uVar5 = puVar9[1];
            *ptr = puVar9 + 2;
            *(uint8_t *)(*(long *)((long)&track->events[uVar16].field_3 + 0x20) + uVar14) =
                 uVar5 - uVar4;
            uVar14 = uVar14 + 1;
          } while (uVar14 < *(ushort *)((long)&track->events[uVar16].field_3 + 10));
        }
        break;
      case 7:
      case 8:
      case 0x10:
      case 0x11:
        uVar4 = *(uint8_t *)((long)puVar8 + 7);
        *ptr = (uint8_t *)(puVar8 + 2);
        track->events[uVar16].field_3.wave.flags = uVar4;
        if ((track->events[uVar16].field_3.wave.flags & 1) == 0) {
          uVar4 = **ptr;
          *ptr = *ptr + 1;
          *(uint8_t *)((long)&track->events[uVar16].field_3 + 8) = uVar4;
          uVar1 = *(undefined4 *)*ptr;
          *ptr = *ptr + 4;
          *(undefined4 *)((long)&track->events[uVar16].field_3 + 0xc) = uVar1;
          uVar1 = *(undefined4 *)*ptr;
          *ptr = *ptr + 4;
          *(undefined4 *)((long)&track->events[uVar16].field_3 + 0x10) = uVar1;
          puVar9 = *ptr;
          *ptr = puVar9 + 5;
          if ((track->events[uVar16].type & 0xfffe) == 0x10) {
            uVar6 = *(ushort *)(puVar9 + 5);
            uVar15 = uVar6 << 8 | uVar6 >> 8;
            if (se == '\0') {
              uVar15 = uVar6;
            }
            *ptr = puVar9 + 7;
            track->events[uVar16].field_3.wave.position = uVar15;
            uVar6 = *(ushort *)*ptr;
            uVar15 = uVar6 << 8 | uVar6 >> 8;
            if (se == '\0') {
              uVar15 = uVar6;
            }
            *ptr = (uint8_t *)((long)*ptr + 2);
            track->events[uVar16].field_3.wave.angle = uVar15;
          }
          else {
            track->events[uVar16].field_3.wave.position = 0;
          }
        }
        else {
          track->events[uVar16].field_3.wave.position = 0;
          uVar1 = *(undefined4 *)*ptr;
          *ptr = *ptr + 4;
          *(undefined4 *)((long)&track->events[uVar16].field_3 + 8) = uVar1;
          fVar2 = *(float *)*ptr;
          *ptr = (uint8_t *)((long)*ptr + 4);
          *(float *)((long)&track->events[uVar16].field_3 + 0xc) = fVar2 * 100.0;
          uVar1 = *(undefined4 *)*ptr;
          *ptr = *ptr + 4;
          *(undefined4 *)((long)&track->events[uVar16].field_3 + 0x10) = uVar1;
          uVar6 = *(ushort *)*ptr;
          *ptr = (uint8_t *)((long)*ptr + 2);
          uVar15 = uVar6 << 8 | uVar6 >> 8;
          if (se == '\0') {
            uVar15 = uVar6;
          }
          *(ushort *)((long)&track->events[uVar16].field_3 + 0x14) = uVar15;
        }
        break;
      case 9:
        uVar7 = *(uint *)((long)puVar8 + 7);
        *ptr = (uint8_t *)((long)puVar8 + 0xb);
        uVar11 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (se == '\0') {
          uVar11 = uVar7;
        }
        track->events[uVar16].field_3.marker.marker = uVar11;
        track->events[uVar16].field_3.wave.angle = 0;
        track->events[uVar16].field_3.marker.frequency = 0;
        break;
      case 0x12:
        uVar7 = *(uint *)((long)puVar8 + 7);
        uVar11 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (se == '\0') {
          uVar11 = uVar7;
        }
        *ptr = (uint8_t *)((long)puVar8 + 0xb);
        track->events[uVar16].field_3.marker.marker = uVar11;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.wave.angle = uVar15;
        uVar6 = *(ushort *)*ptr;
        uVar15 = uVar6 << 8 | uVar6 >> 8;
        if (se == '\0') {
          uVar15 = uVar6;
        }
        *ptr = (uint8_t *)((long)*ptr + 2);
        track->events[uVar16].field_3.marker.frequency = uVar15;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < track->eventCount);
  }
  return;
}

Assistant:

void FACT_INTERNAL_ParseTrackEvents(
	uint8_t **ptr,
	uint8_t se,
	FACTTrack *track,
	FAudioMallocFunc pMalloc
) {
	uint32_t evtInfo;
	uint8_t minWeight, maxWeight, separator;
	uint8_t i;
	uint16_t j;

	track->eventCount = read_u8(ptr);
	track->events = (FACTEvent*) pMalloc(
		sizeof(FACTEvent) *
		track->eventCount
	);
	FAudio_zero(track->events, sizeof(FACTEvent) * track->eventCount);
	for (i = 0; i < track->eventCount; i += 1)
	{
		evtInfo = read_u32(ptr, se);
		track->events[i].randomOffset = read_u16(ptr, se);

		track->events[i].type = evtInfo & 0x001F;
		track->events[i].timestamp = (evtInfo >> 5) & 0xFFFF;

		separator = read_u8(ptr);
		FAudio_assert(separator == 0xFF); /* Separator? */

		#define EVTTYPE(t) (track->events[i].type == t)
		if (EVTTYPE(FACTEVENT_STOP))
		{
			track->events[i].stop.flags = read_u8(ptr);
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVE))
		{
			/* Basic Wave */
			track->events[i].wave.isComplex = 0;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.simple.track = read_u16(ptr, se);
			track->events[i].wave.simple.wavebank = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* No Effect Variation */
			track->events[i].wave.variationFlags = 0;
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVETRACKVARIATION))
		{
			/* Complex Wave */
			track->events[i].wave.isComplex = 1;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Track Variation */
			evtInfo = read_u32(ptr, se);
			track->events[i].wave.complex.trackCount = evtInfo & 0xFFFF;
			track->events[i].wave.complex.variation = (evtInfo >> 16) & 0xFFFF;
			*ptr += 4; /* Unknown values */
			track->events[i].wave.complex.tracks = (uint16_t*) pMalloc(
				sizeof(uint16_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.wavebanks = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.weights = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			for (j = 0; j < track->events[i].wave.complex.trackCount; j += 1)
			{
				track->events[i].wave.complex.tracks[j] = read_u16(ptr, se);
				track->events[i].wave.complex.wavebanks[j] = read_u8(ptr);
				minWeight = read_u8(ptr);
				maxWeight = read_u8(ptr);
				track->events[i].wave.complex.weights[j] = (
					maxWeight - minWeight
				);
			}

			/* No Effect Variation */
			track->events[i].wave.variationFlags = 0;
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVEEFFECTVARIATION))
		{
			/* Basic Wave */
			track->events[i].wave.isComplex = 0;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.simple.track = read_u16(ptr, se);
			track->events[i].wave.simple.wavebank = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Effect Variation */
			track->events[i].wave.minPitch = read_s16(ptr, se);
			track->events[i].wave.maxPitch = read_s16(ptr, se);
			track->events[i].wave.minVolume = read_volbyte(ptr);
			track->events[i].wave.maxVolume = read_volbyte(ptr);
			track->events[i].wave.minFrequency = read_f32(ptr, se);
			track->events[i].wave.maxFrequency = read_f32(ptr, se);
			track->events[i].wave.minQFactor = read_f32(ptr, se);
			track->events[i].wave.maxQFactor = read_f32(ptr, se);
			track->events[i].wave.variationFlags = read_u16(ptr, se);
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVETRACKEFFECTVARIATION))
		{
			/* Complex Wave */
			track->events[i].wave.isComplex = 1;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Effect Variation */
			track->events[i].wave.minPitch = read_s16(ptr, se);
			track->events[i].wave.maxPitch = read_s16(ptr, se);
			track->events[i].wave.minVolume = read_volbyte(ptr);
			track->events[i].wave.maxVolume = read_volbyte(ptr);
			track->events[i].wave.minFrequency = read_f32(ptr, se);
			track->events[i].wave.maxFrequency = read_f32(ptr, se);
			track->events[i].wave.minQFactor = read_f32(ptr, se);
			track->events[i].wave.maxQFactor = read_f32(ptr, se);
			track->events[i].wave.variationFlags = read_u16(ptr, se);

			/* Track Variation */
			evtInfo = read_u32(ptr, se);
			track->events[i].wave.complex.trackCount = evtInfo & 0xFFFF;
			track->events[i].wave.complex.variation = (evtInfo >> 16) & 0xFFFF;
			*ptr += 4; /* Unknown values */
			track->events[i].wave.complex.tracks = (uint16_t*) pMalloc(
				sizeof(uint16_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.wavebanks = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.weights = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			for (j = 0; j < track->events[i].wave.complex.trackCount; j += 1)
			{
				track->events[i].wave.complex.tracks[j] = read_u16(ptr, se);
				track->events[i].wave.complex.wavebanks[j] = read_u8(ptr);
				minWeight = read_u8(ptr);
				maxWeight = read_u8(ptr);
				track->events[i].wave.complex.weights[j] = (
					maxWeight - minWeight
				);
			}
		}
		else if (	EVTTYPE(FACTEVENT_PITCH) ||
				EVTTYPE(FACTEVENT_VOLUME) ||
				EVTTYPE(FACTEVENT_PITCHREPEATING) ||
				EVTTYPE(FACTEVENT_VOLUMEREPEATING)	)
		{
			track->events[i].value.settings = read_u8(ptr);
			if (track->events[i].value.settings & 1) /* Ramp */
			{
				track->events[i].value.repeats = 0;
				track->events[i].value.ramp.initialValue = read_f32(ptr, se);
				track->events[i].value.ramp.initialSlope = read_f32(ptr, se) * 100;
				track->events[i].value.ramp.slopeDelta = read_f32(ptr, se);
				track->events[i].value.ramp.duration = read_u16(ptr, se);
			}
			else /* Equation */
			{
				track->events[i].value.equation.flags = read_u8(ptr);

				/* SetValue, SetRandomValue, anything else? */
				FAudio_assert(track->events[i].value.equation.flags & 0x0C);

				track->events[i].value.equation.value1 = read_f32(ptr, se);
				track->events[i].value.equation.value2 = read_f32(ptr, se);

				*ptr += 5; /* Unknown values */

				if (	EVTTYPE(FACTEVENT_PITCHREPEATING) ||
					EVTTYPE(FACTEVENT_VOLUMEREPEATING)	)
				{
					track->events[i].value.repeats = read_u16(ptr, se);
					track->events[i].value.frequency = read_u16(ptr, se);
				}
				else
				{
					track->events[i].value.repeats = 0;
				}
			}
		}
		else if (EVTTYPE(FACTEVENT_MARKER))
		{
			track->events[i].marker.marker = read_u32(ptr, se);
			track->events[i].marker.repeats = 0;
			track->events[i].marker.frequency = 0;
		}
		else if (EVTTYPE(FACTEVENT_MARKERREPEATING))
		{
			track->events[i].marker.marker = read_u32(ptr, se);
			track->events[i].marker.repeats = read_u16(ptr, se);
			track->events[i].marker.frequency = read_u16(ptr, se);
		}
		else
		{
			FAudio_assert(0 && "Unknown event type!");
		}
		#undef EVTTYPE
	}
}